

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::FileDescriptorProto::ByteSize(FileDescriptorProto *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  int iVar5;
  FileOptions *value;
  SourceCodeInfo *value_00;
  string *psVar6;
  DescriptorProto *value_01;
  EnumDescriptorProto *value_02;
  ServiceDescriptorProto *value_03;
  FieldDescriptorProto *value_04;
  UnknownFieldSet *pUVar7;
  int local_38;
  int local_34;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int data_size_1;
  int i_1;
  int data_size;
  int i;
  int total_size;
  FileDescriptorProto *this_local;
  
  data_size = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar6 = name_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar6);
      data_size = iVar2 + 1;
    }
    bVar1 = has_package(this);
    if (bVar1) {
      psVar6 = package_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar6);
      data_size = iVar2 + 1 + data_size;
    }
  }
  if ((this->_has_bits_[0] & 0x1fe00) != 0) {
    bVar1 = has_options(this);
    if (bVar1) {
      value = options(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FileOptions>(value);
      data_size = iVar2 + 1 + data_size;
    }
    bVar1 = has_source_code_info(this);
    if (bVar1) {
      value_00 = source_code_info(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::SourceCodeInfo>
                        (value_00);
      data_size = iVar2 + 1 + data_size;
    }
  }
  iVar2 = dependency_size(this);
  data_size = iVar2 + data_size;
  for (i_1 = 0; iVar2 = dependency_size(this), i_1 < iVar2; i_1 = i_1 + 1) {
    psVar6 = dependency_abi_cxx11_(this,i_1);
    iVar2 = internal::WireFormatLite::StringSize(psVar6);
    data_size = iVar2 + data_size;
  }
  data_size_1 = 0;
  for (i_2 = 0; iVar2 = public_dependency_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    iVar3 = public_dependency(this,i_2);
    iVar2 = internal::WireFormatLite::Int32Size(iVar3);
    data_size_1 = iVar2 + data_size_1;
  }
  iVar2 = public_dependency_size(this);
  i_3 = 0;
  for (i_4 = 0; iVar4 = weak_dependency_size(this), i_4 < iVar4; i_4 = i_4 + 1) {
    iVar3 = weak_dependency(this,i_4);
    iVar4 = internal::WireFormatLite::Int32Size(iVar3);
    i_3 = iVar4 + i_3;
  }
  iVar4 = weak_dependency_size(this);
  iVar5 = message_type_size(this);
  data_size = iVar5 + iVar4 + i_3 + iVar2 + data_size_1 + data_size;
  for (i_5 = 0; iVar2 = message_type_size(this), i_5 < iVar2; i_5 = i_5 + 1) {
    value_01 = message_type(this,i_5);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>
                      (value_01);
    data_size = iVar2 + data_size;
  }
  iVar2 = enum_type_size(this);
  data_size = iVar2 + data_size;
  for (i_6 = 0; iVar2 = enum_type_size(this), i_6 < iVar2; i_6 = i_6 + 1) {
    value_02 = enum_type(this,i_6);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_02);
    data_size = iVar2 + data_size;
  }
  iVar2 = service_size(this);
  data_size = iVar2 + data_size;
  for (local_34 = 0; iVar2 = service_size(this), local_34 < iVar2; local_34 = local_34 + 1) {
    value_03 = service(this,local_34);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::ServiceDescriptorProto>
                      (value_03);
    data_size = iVar2 + data_size;
  }
  iVar2 = extension_size(this);
  data_size = iVar2 + data_size;
  for (local_38 = 0; iVar2 = extension_size(this), local_38 < iVar2; local_38 = local_38 + 1) {
    value_04 = extension(this,local_38);
    iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (value_04);
    data_size = iVar2 + data_size;
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar7);
    data_size = iVar2 + data_size;
  }
  this->_cached_size_ = data_size;
  return data_size;
}

Assistant:

int FileDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional string package = 2;
    if (has_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->package());
    }

  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    // optional .google.protobuf.FileOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

    // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
    if (has_source_code_info()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->source_code_info());
    }

  }
  // repeated string dependency = 3;
  total_size += 1 * this->dependency_size();
  for (int i = 0; i < this->dependency_size(); i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->dependency(i));
  }

  // repeated int32 public_dependency = 10;
  {
    int data_size = 0;
    for (int i = 0; i < this->public_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->public_dependency(i));
    }
    total_size += 1 * this->public_dependency_size() + data_size;
  }

  // repeated int32 weak_dependency = 11;
  {
    int data_size = 0;
    for (int i = 0; i < this->weak_dependency_size(); i++) {
      data_size += ::google::protobuf::internal::WireFormatLite::
        Int32Size(this->weak_dependency(i));
    }
    total_size += 1 * this->weak_dependency_size() + data_size;
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  total_size += 1 * this->message_type_size();
  for (int i = 0; i < this->message_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->message_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  total_size += 1 * this->service_size();
  for (int i = 0; i < this->service_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->service(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}